

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx512vnni_gemm.h
# Opt level: O1

void intgemm::AVX512VNNI::Kernels8::Multiply<intgemm::callbacks::UnquantizeAndAddBiasAndWriteRelu>
               (int8_t *A,int8_t *B,Index A_rows,Index width,Index B_cols,
               UnquantizeAndAddBiasAndWriteRelu callback)

{
  float *pfVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  ulong uVar11;
  char cVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [32];
  undefined1 in_ZMM13 [64];
  undefined1 auVar43 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  ulong local_2c0;
  
  if (B_cols != 0) {
    local_2c0 = 0;
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0xd0c050409080100));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0xf0e07060b0a0302));
    auVar29 = vpternlogd_avx512f(in_ZMM13,in_ZMM13,in_ZMM13,0xff);
    uVar24 = 0;
    do {
      if (A_rows != 0) {
        uVar22 = 0;
        uVar25 = 0;
        do {
          auVar41 = ZEXT1664((undefined1  [16])0x0);
          auVar43 = ZEXT1664((undefined1  [16])0x0);
          in_ZMM16 = vpxord_avx512f(in_ZMM16,in_ZMM16);
          in_ZMM17 = vpxord_avx512f(in_ZMM17,in_ZMM17);
          in_ZMM18 = vpxord_avx512f(in_ZMM18,in_ZMM18);
          in_ZMM19 = vpxord_avx512f(in_ZMM19,in_ZMM19);
          in_ZMM20 = vpxord_avx512f(in_ZMM20,in_ZMM20);
          in_ZMM22 = vpxord_avx512f(in_ZMM22,in_ZMM22);
          in_ZMM21 = vpxord_avx512f(in_ZMM21,in_ZMM21);
          if (0x3f < width) {
            uVar21 = 0;
            do {
              auVar30 = vmovdqa64_avx512f(*(undefined1 (*) [64])(B + uVar21 * 8 + local_2c0 * 0x40))
              ;
              auVar31 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                           (B + uVar21 * 8 + local_2c0 * 0x40 + 0x40));
              auVar32 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                           (B + uVar21 * 8 + local_2c0 * 0x40 + 0x80));
              auVar33 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                           (B + uVar21 * 8 + local_2c0 * 0x40 + 0xc0));
              auVar34 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                           (B + uVar21 * 8 + local_2c0 * 0x40 + 0x100));
              auVar35 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                           (B + uVar21 * 8 + local_2c0 * 0x40 + 0x140));
              auVar36 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                           (B + uVar21 * 8 + local_2c0 * 0x40 + 0x180));
              auVar37 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                           (B + uVar21 * 8 + local_2c0 * 0x40 + 0x1c0));
              auVar38 = vmovdqa64_avx512f(*(undefined1 (*) [64])(A + uVar21 + uVar22));
              uVar11 = vpcmpgtb_avx512bw(auVar38,auVar29);
              auVar38 = vpabsb_avx512bw(auVar38);
              auVar39 = vpsubb_avx512bw(auVar41,auVar30);
              auVar30 = vmovdqu8_avx512bw(auVar30);
              bVar2 = (byte)uVar11;
              auVar40[0] = (bVar2 & 1) * auVar30[0] | !(bool)(bVar2 & 1) * auVar39[0];
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar40[1] = bVar3 * auVar30[1] | !bVar3 * auVar39[1];
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar40[2] = bVar3 * auVar30[2] | !bVar3 * auVar39[2];
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar40[3] = bVar3 * auVar30[3] | !bVar3 * auVar39[3];
              bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
              auVar40[4] = bVar3 * auVar30[4] | !bVar3 * auVar39[4];
              bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
              auVar40[5] = bVar3 * auVar30[5] | !bVar3 * auVar39[5];
              bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
              auVar40[6] = bVar3 * auVar30[6] | !bVar3 * auVar39[6];
              bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
              auVar40[7] = bVar3 * auVar30[7] | !bVar3 * auVar39[7];
              bVar4 = (byte)(uVar11 >> 8);
              auVar40[8] = (bVar4 & 1) * auVar30[8] | !(bool)(bVar4 & 1) * auVar39[8];
              bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
              auVar40[9] = bVar3 * auVar30[9] | !bVar3 * auVar39[9];
              bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
              auVar40[10] = bVar3 * auVar30[10] | !bVar3 * auVar39[10];
              bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
              auVar40[0xb] = bVar3 * auVar30[0xb] | !bVar3 * auVar39[0xb];
              bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
              auVar40[0xc] = bVar3 * auVar30[0xc] | !bVar3 * auVar39[0xc];
              bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
              auVar40[0xd] = bVar3 * auVar30[0xd] | !bVar3 * auVar39[0xd];
              bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
              auVar40[0xe] = bVar3 * auVar30[0xe] | !bVar3 * auVar39[0xe];
              bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
              auVar40[0xf] = bVar3 * auVar30[0xf] | !bVar3 * auVar39[0xf];
              bVar5 = (byte)(uVar11 >> 0x10);
              auVar40[0x10] = (bVar5 & 1) * auVar30[0x10] | !(bool)(bVar5 & 1) * auVar39[0x10];
              bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
              auVar40[0x11] = bVar3 * auVar30[0x11] | !bVar3 * auVar39[0x11];
              bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
              auVar40[0x12] = bVar3 * auVar30[0x12] | !bVar3 * auVar39[0x12];
              bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
              auVar40[0x13] = bVar3 * auVar30[0x13] | !bVar3 * auVar39[0x13];
              bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
              auVar40[0x14] = bVar3 * auVar30[0x14] | !bVar3 * auVar39[0x14];
              bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
              auVar40[0x15] = bVar3 * auVar30[0x15] | !bVar3 * auVar39[0x15];
              bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
              auVar40[0x16] = bVar3 * auVar30[0x16] | !bVar3 * auVar39[0x16];
              bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
              auVar40[0x17] = bVar3 * auVar30[0x17] | !bVar3 * auVar39[0x17];
              bVar6 = (byte)(uVar11 >> 0x18);
              auVar40[0x18] = (bVar6 & 1) * auVar30[0x18] | !(bool)(bVar6 & 1) * auVar39[0x18];
              bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
              auVar40[0x19] = bVar3 * auVar30[0x19] | !bVar3 * auVar39[0x19];
              bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
              auVar40[0x1a] = bVar3 * auVar30[0x1a] | !bVar3 * auVar39[0x1a];
              bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
              auVar40[0x1b] = bVar3 * auVar30[0x1b] | !bVar3 * auVar39[0x1b];
              bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
              auVar40[0x1c] = bVar3 * auVar30[0x1c] | !bVar3 * auVar39[0x1c];
              bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
              auVar40[0x1d] = bVar3 * auVar30[0x1d] | !bVar3 * auVar39[0x1d];
              bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
              auVar40[0x1e] = bVar3 * auVar30[0x1e] | !bVar3 * auVar39[0x1e];
              bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
              auVar40[0x1f] = bVar3 * auVar30[0x1f] | !bVar3 * auVar39[0x1f];
              bVar7 = (byte)(uVar11 >> 0x20);
              auVar40[0x20] = (bVar7 & 1) * auVar30[0x20] | !(bool)(bVar7 & 1) * auVar39[0x20];
              bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
              auVar40[0x21] = bVar3 * auVar30[0x21] | !bVar3 * auVar39[0x21];
              bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
              auVar40[0x22] = bVar3 * auVar30[0x22] | !bVar3 * auVar39[0x22];
              bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
              auVar40[0x23] = bVar3 * auVar30[0x23] | !bVar3 * auVar39[0x23];
              bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
              auVar40[0x24] = bVar3 * auVar30[0x24] | !bVar3 * auVar39[0x24];
              bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
              auVar40[0x25] = bVar3 * auVar30[0x25] | !bVar3 * auVar39[0x25];
              bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
              auVar40[0x26] = bVar3 * auVar30[0x26] | !bVar3 * auVar39[0x26];
              bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
              auVar40[0x27] = bVar3 * auVar30[0x27] | !bVar3 * auVar39[0x27];
              bVar8 = (byte)(uVar11 >> 0x28);
              auVar40[0x28] = (bVar8 & 1) * auVar30[0x28] | !(bool)(bVar8 & 1) * auVar39[0x28];
              bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
              auVar40[0x29] = bVar3 * auVar30[0x29] | !bVar3 * auVar39[0x29];
              bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
              auVar40[0x2a] = bVar3 * auVar30[0x2a] | !bVar3 * auVar39[0x2a];
              bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
              auVar40[0x2b] = bVar3 * auVar30[0x2b] | !bVar3 * auVar39[0x2b];
              bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
              auVar40[0x2c] = bVar3 * auVar30[0x2c] | !bVar3 * auVar39[0x2c];
              bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
              auVar40[0x2d] = bVar3 * auVar30[0x2d] | !bVar3 * auVar39[0x2d];
              bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
              auVar40[0x2e] = bVar3 * auVar30[0x2e] | !bVar3 * auVar39[0x2e];
              bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
              auVar40[0x2f] = bVar3 * auVar30[0x2f] | !bVar3 * auVar39[0x2f];
              bVar9 = (byte)(uVar11 >> 0x30);
              auVar40[0x30] = (bVar9 & 1) * auVar30[0x30] | !(bool)(bVar9 & 1) * auVar39[0x30];
              bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
              auVar40[0x31] = bVar3 * auVar30[0x31] | !bVar3 * auVar39[0x31];
              bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
              auVar40[0x32] = bVar3 * auVar30[0x32] | !bVar3 * auVar39[0x32];
              bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
              auVar40[0x33] = bVar3 * auVar30[0x33] | !bVar3 * auVar39[0x33];
              bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
              auVar40[0x34] = bVar3 * auVar30[0x34] | !bVar3 * auVar39[0x34];
              bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
              auVar40[0x35] = bVar3 * auVar30[0x35] | !bVar3 * auVar39[0x35];
              bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
              auVar40[0x36] = bVar3 * auVar30[0x36] | !bVar3 * auVar39[0x36];
              bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
              auVar40[0x37] = bVar3 * auVar30[0x37] | !bVar3 * auVar39[0x37];
              bVar10 = (byte)(uVar11 >> 0x38);
              auVar40[0x38] = (bVar10 & 1) * auVar30[0x38] | !(bool)(bVar10 & 1) * auVar39[0x38];
              bVar3 = (bool)(bVar10 >> 1 & 1);
              auVar40[0x39] = bVar3 * auVar30[0x39] | !bVar3 * auVar39[0x39];
              bVar3 = (bool)(bVar10 >> 2 & 1);
              auVar40[0x3a] = bVar3 * auVar30[0x3a] | !bVar3 * auVar39[0x3a];
              bVar3 = (bool)(bVar10 >> 3 & 1);
              auVar40[0x3b] = bVar3 * auVar30[0x3b] | !bVar3 * auVar39[0x3b];
              bVar3 = (bool)(bVar10 >> 4 & 1);
              auVar40[0x3c] = bVar3 * auVar30[0x3c] | !bVar3 * auVar39[0x3c];
              bVar3 = (bool)(bVar10 >> 5 & 1);
              auVar40[0x3d] = bVar3 * auVar30[0x3d] | !bVar3 * auVar39[0x3d];
              bVar3 = (bool)(bVar10 >> 6 & 1);
              auVar40[0x3e] = bVar3 * auVar30[0x3e] | !bVar3 * auVar39[0x3e];
              cVar12 = (char)bVar10 >> 7;
              auVar40[0x3f] = -cVar12 * auVar30[0x3f] | !(bool)-cVar12 * auVar39[0x3f];
              auVar30 = vpsubb_avx512bw(auVar41,auVar31);
              auVar31 = vmovdqu8_avx512bw(auVar31);
              auVar39[0] = (bVar2 & 1) * auVar31[0] | !(bool)(bVar2 & 1) * auVar30[0];
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar39[1] = bVar3 * auVar31[1] | !bVar3 * auVar30[1];
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar39[2] = bVar3 * auVar31[2] | !bVar3 * auVar30[2];
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar39[3] = bVar3 * auVar31[3] | !bVar3 * auVar30[3];
              bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
              auVar39[4] = bVar3 * auVar31[4] | !bVar3 * auVar30[4];
              bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
              auVar39[5] = bVar3 * auVar31[5] | !bVar3 * auVar30[5];
              bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
              auVar39[6] = bVar3 * auVar31[6] | !bVar3 * auVar30[6];
              bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
              auVar39[7] = bVar3 * auVar31[7] | !bVar3 * auVar30[7];
              auVar39[8] = (bVar4 & 1) * auVar31[8] | !(bool)(bVar4 & 1) * auVar30[8];
              bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
              auVar39[9] = bVar3 * auVar31[9] | !bVar3 * auVar30[9];
              bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
              auVar39[10] = bVar3 * auVar31[10] | !bVar3 * auVar30[10];
              bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
              auVar39[0xb] = bVar3 * auVar31[0xb] | !bVar3 * auVar30[0xb];
              bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
              auVar39[0xc] = bVar3 * auVar31[0xc] | !bVar3 * auVar30[0xc];
              bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
              auVar39[0xd] = bVar3 * auVar31[0xd] | !bVar3 * auVar30[0xd];
              bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
              auVar39[0xe] = bVar3 * auVar31[0xe] | !bVar3 * auVar30[0xe];
              bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
              auVar39[0xf] = bVar3 * auVar31[0xf] | !bVar3 * auVar30[0xf];
              auVar39[0x10] = (bVar5 & 1) * auVar31[0x10] | !(bool)(bVar5 & 1) * auVar30[0x10];
              bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
              auVar39[0x11] = bVar3 * auVar31[0x11] | !bVar3 * auVar30[0x11];
              bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
              auVar39[0x12] = bVar3 * auVar31[0x12] | !bVar3 * auVar30[0x12];
              bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
              auVar39[0x13] = bVar3 * auVar31[0x13] | !bVar3 * auVar30[0x13];
              bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
              auVar39[0x14] = bVar3 * auVar31[0x14] | !bVar3 * auVar30[0x14];
              bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
              auVar39[0x15] = bVar3 * auVar31[0x15] | !bVar3 * auVar30[0x15];
              bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
              auVar39[0x16] = bVar3 * auVar31[0x16] | !bVar3 * auVar30[0x16];
              bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
              auVar39[0x17] = bVar3 * auVar31[0x17] | !bVar3 * auVar30[0x17];
              auVar39[0x18] = (bVar6 & 1) * auVar31[0x18] | !(bool)(bVar6 & 1) * auVar30[0x18];
              bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
              auVar39[0x19] = bVar3 * auVar31[0x19] | !bVar3 * auVar30[0x19];
              bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
              auVar39[0x1a] = bVar3 * auVar31[0x1a] | !bVar3 * auVar30[0x1a];
              bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
              auVar39[0x1b] = bVar3 * auVar31[0x1b] | !bVar3 * auVar30[0x1b];
              bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
              auVar39[0x1c] = bVar3 * auVar31[0x1c] | !bVar3 * auVar30[0x1c];
              bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
              auVar39[0x1d] = bVar3 * auVar31[0x1d] | !bVar3 * auVar30[0x1d];
              bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
              auVar39[0x1e] = bVar3 * auVar31[0x1e] | !bVar3 * auVar30[0x1e];
              bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
              auVar39[0x1f] = bVar3 * auVar31[0x1f] | !bVar3 * auVar30[0x1f];
              auVar39[0x20] = (bVar7 & 1) * auVar31[0x20] | !(bool)(bVar7 & 1) * auVar30[0x20];
              bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
              auVar39[0x21] = bVar3 * auVar31[0x21] | !bVar3 * auVar30[0x21];
              bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
              auVar39[0x22] = bVar3 * auVar31[0x22] | !bVar3 * auVar30[0x22];
              bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
              auVar39[0x23] = bVar3 * auVar31[0x23] | !bVar3 * auVar30[0x23];
              bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
              auVar39[0x24] = bVar3 * auVar31[0x24] | !bVar3 * auVar30[0x24];
              bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
              auVar39[0x25] = bVar3 * auVar31[0x25] | !bVar3 * auVar30[0x25];
              bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
              auVar39[0x26] = bVar3 * auVar31[0x26] | !bVar3 * auVar30[0x26];
              bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
              auVar39[0x27] = bVar3 * auVar31[0x27] | !bVar3 * auVar30[0x27];
              auVar39[0x28] = (bVar8 & 1) * auVar31[0x28] | !(bool)(bVar8 & 1) * auVar30[0x28];
              bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
              auVar39[0x29] = bVar3 * auVar31[0x29] | !bVar3 * auVar30[0x29];
              bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
              auVar39[0x2a] = bVar3 * auVar31[0x2a] | !bVar3 * auVar30[0x2a];
              bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
              auVar39[0x2b] = bVar3 * auVar31[0x2b] | !bVar3 * auVar30[0x2b];
              bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
              auVar39[0x2c] = bVar3 * auVar31[0x2c] | !bVar3 * auVar30[0x2c];
              bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
              auVar39[0x2d] = bVar3 * auVar31[0x2d] | !bVar3 * auVar30[0x2d];
              bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
              auVar39[0x2e] = bVar3 * auVar31[0x2e] | !bVar3 * auVar30[0x2e];
              bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
              auVar39[0x2f] = bVar3 * auVar31[0x2f] | !bVar3 * auVar30[0x2f];
              auVar39[0x30] = (bVar9 & 1) * auVar31[0x30] | !(bool)(bVar9 & 1) * auVar30[0x30];
              bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
              auVar39[0x31] = bVar3 * auVar31[0x31] | !bVar3 * auVar30[0x31];
              bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
              auVar39[0x32] = bVar3 * auVar31[0x32] | !bVar3 * auVar30[0x32];
              bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
              auVar39[0x33] = bVar3 * auVar31[0x33] | !bVar3 * auVar30[0x33];
              bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
              auVar39[0x34] = bVar3 * auVar31[0x34] | !bVar3 * auVar30[0x34];
              bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
              auVar39[0x35] = bVar3 * auVar31[0x35] | !bVar3 * auVar30[0x35];
              bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
              auVar39[0x36] = bVar3 * auVar31[0x36] | !bVar3 * auVar30[0x36];
              bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
              auVar39[0x37] = bVar3 * auVar31[0x37] | !bVar3 * auVar30[0x37];
              auVar39[0x38] = (bVar10 & 1) * auVar31[0x38] | !(bool)(bVar10 & 1) * auVar30[0x38];
              bVar3 = (bool)(bVar10 >> 1 & 1);
              auVar39[0x39] = bVar3 * auVar31[0x39] | !bVar3 * auVar30[0x39];
              bVar3 = (bool)(bVar10 >> 2 & 1);
              auVar39[0x3a] = bVar3 * auVar31[0x3a] | !bVar3 * auVar30[0x3a];
              bVar3 = (bool)(bVar10 >> 3 & 1);
              auVar39[0x3b] = bVar3 * auVar31[0x3b] | !bVar3 * auVar30[0x3b];
              bVar3 = (bool)(bVar10 >> 4 & 1);
              auVar39[0x3c] = bVar3 * auVar31[0x3c] | !bVar3 * auVar30[0x3c];
              bVar3 = (bool)(bVar10 >> 5 & 1);
              auVar39[0x3d] = bVar3 * auVar31[0x3d] | !bVar3 * auVar30[0x3d];
              bVar3 = (bool)(bVar10 >> 6 & 1);
              auVar39[0x3e] = bVar3 * auVar31[0x3e] | !bVar3 * auVar30[0x3e];
              auVar39[0x3f] = -cVar12 * auVar31[0x3f] | !(bool)-cVar12 * auVar30[0x3f];
              auVar30 = vpsubb_avx512bw(auVar41,auVar32);
              auVar32 = vmovdqu8_avx512bw(auVar32);
              auVar31[0] = (bVar2 & 1) * auVar32[0] | !(bool)(bVar2 & 1) * auVar30[0];
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar31[1] = bVar3 * auVar32[1] | !bVar3 * auVar30[1];
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar31[2] = bVar3 * auVar32[2] | !bVar3 * auVar30[2];
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar31[3] = bVar3 * auVar32[3] | !bVar3 * auVar30[3];
              bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
              auVar31[4] = bVar3 * auVar32[4] | !bVar3 * auVar30[4];
              bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
              auVar31[5] = bVar3 * auVar32[5] | !bVar3 * auVar30[5];
              bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
              auVar31[6] = bVar3 * auVar32[6] | !bVar3 * auVar30[6];
              bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
              auVar31[7] = bVar3 * auVar32[7] | !bVar3 * auVar30[7];
              auVar31[8] = (bVar4 & 1) * auVar32[8] | !(bool)(bVar4 & 1) * auVar30[8];
              bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
              auVar31[9] = bVar3 * auVar32[9] | !bVar3 * auVar30[9];
              bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
              auVar31[10] = bVar3 * auVar32[10] | !bVar3 * auVar30[10];
              bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
              auVar31[0xb] = bVar3 * auVar32[0xb] | !bVar3 * auVar30[0xb];
              bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
              auVar31[0xc] = bVar3 * auVar32[0xc] | !bVar3 * auVar30[0xc];
              bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
              auVar31[0xd] = bVar3 * auVar32[0xd] | !bVar3 * auVar30[0xd];
              bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
              auVar31[0xe] = bVar3 * auVar32[0xe] | !bVar3 * auVar30[0xe];
              bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
              auVar31[0xf] = bVar3 * auVar32[0xf] | !bVar3 * auVar30[0xf];
              auVar31[0x10] = (bVar5 & 1) * auVar32[0x10] | !(bool)(bVar5 & 1) * auVar30[0x10];
              bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
              auVar31[0x11] = bVar3 * auVar32[0x11] | !bVar3 * auVar30[0x11];
              bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
              auVar31[0x12] = bVar3 * auVar32[0x12] | !bVar3 * auVar30[0x12];
              bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
              auVar31[0x13] = bVar3 * auVar32[0x13] | !bVar3 * auVar30[0x13];
              bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
              auVar31[0x14] = bVar3 * auVar32[0x14] | !bVar3 * auVar30[0x14];
              bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
              auVar31[0x15] = bVar3 * auVar32[0x15] | !bVar3 * auVar30[0x15];
              bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
              auVar31[0x16] = bVar3 * auVar32[0x16] | !bVar3 * auVar30[0x16];
              bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
              auVar31[0x17] = bVar3 * auVar32[0x17] | !bVar3 * auVar30[0x17];
              auVar31[0x18] = (bVar6 & 1) * auVar32[0x18] | !(bool)(bVar6 & 1) * auVar30[0x18];
              bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
              auVar31[0x19] = bVar3 * auVar32[0x19] | !bVar3 * auVar30[0x19];
              bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
              auVar31[0x1a] = bVar3 * auVar32[0x1a] | !bVar3 * auVar30[0x1a];
              bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
              auVar31[0x1b] = bVar3 * auVar32[0x1b] | !bVar3 * auVar30[0x1b];
              bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
              auVar31[0x1c] = bVar3 * auVar32[0x1c] | !bVar3 * auVar30[0x1c];
              bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
              auVar31[0x1d] = bVar3 * auVar32[0x1d] | !bVar3 * auVar30[0x1d];
              bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
              auVar31[0x1e] = bVar3 * auVar32[0x1e] | !bVar3 * auVar30[0x1e];
              bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
              auVar31[0x1f] = bVar3 * auVar32[0x1f] | !bVar3 * auVar30[0x1f];
              auVar31[0x20] = (bVar7 & 1) * auVar32[0x20] | !(bool)(bVar7 & 1) * auVar30[0x20];
              bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
              auVar31[0x21] = bVar3 * auVar32[0x21] | !bVar3 * auVar30[0x21];
              bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
              auVar31[0x22] = bVar3 * auVar32[0x22] | !bVar3 * auVar30[0x22];
              bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
              auVar31[0x23] = bVar3 * auVar32[0x23] | !bVar3 * auVar30[0x23];
              bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
              auVar31[0x24] = bVar3 * auVar32[0x24] | !bVar3 * auVar30[0x24];
              bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
              auVar31[0x25] = bVar3 * auVar32[0x25] | !bVar3 * auVar30[0x25];
              bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
              auVar31[0x26] = bVar3 * auVar32[0x26] | !bVar3 * auVar30[0x26];
              bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
              auVar31[0x27] = bVar3 * auVar32[0x27] | !bVar3 * auVar30[0x27];
              auVar31[0x28] = (bVar8 & 1) * auVar32[0x28] | !(bool)(bVar8 & 1) * auVar30[0x28];
              bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
              auVar31[0x29] = bVar3 * auVar32[0x29] | !bVar3 * auVar30[0x29];
              bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
              auVar31[0x2a] = bVar3 * auVar32[0x2a] | !bVar3 * auVar30[0x2a];
              bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
              auVar31[0x2b] = bVar3 * auVar32[0x2b] | !bVar3 * auVar30[0x2b];
              bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
              auVar31[0x2c] = bVar3 * auVar32[0x2c] | !bVar3 * auVar30[0x2c];
              bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
              auVar31[0x2d] = bVar3 * auVar32[0x2d] | !bVar3 * auVar30[0x2d];
              bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
              auVar31[0x2e] = bVar3 * auVar32[0x2e] | !bVar3 * auVar30[0x2e];
              bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
              auVar31[0x2f] = bVar3 * auVar32[0x2f] | !bVar3 * auVar30[0x2f];
              auVar31[0x30] = (bVar9 & 1) * auVar32[0x30] | !(bool)(bVar9 & 1) * auVar30[0x30];
              bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
              auVar31[0x31] = bVar3 * auVar32[0x31] | !bVar3 * auVar30[0x31];
              bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
              auVar31[0x32] = bVar3 * auVar32[0x32] | !bVar3 * auVar30[0x32];
              bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
              auVar31[0x33] = bVar3 * auVar32[0x33] | !bVar3 * auVar30[0x33];
              bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
              auVar31[0x34] = bVar3 * auVar32[0x34] | !bVar3 * auVar30[0x34];
              bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
              auVar31[0x35] = bVar3 * auVar32[0x35] | !bVar3 * auVar30[0x35];
              bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
              auVar31[0x36] = bVar3 * auVar32[0x36] | !bVar3 * auVar30[0x36];
              bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
              auVar31[0x37] = bVar3 * auVar32[0x37] | !bVar3 * auVar30[0x37];
              auVar31[0x38] = (bVar10 & 1) * auVar32[0x38] | !(bool)(bVar10 & 1) * auVar30[0x38];
              bVar3 = (bool)(bVar10 >> 1 & 1);
              auVar31[0x39] = bVar3 * auVar32[0x39] | !bVar3 * auVar30[0x39];
              bVar3 = (bool)(bVar10 >> 2 & 1);
              auVar31[0x3a] = bVar3 * auVar32[0x3a] | !bVar3 * auVar30[0x3a];
              bVar3 = (bool)(bVar10 >> 3 & 1);
              auVar31[0x3b] = bVar3 * auVar32[0x3b] | !bVar3 * auVar30[0x3b];
              bVar3 = (bool)(bVar10 >> 4 & 1);
              auVar31[0x3c] = bVar3 * auVar32[0x3c] | !bVar3 * auVar30[0x3c];
              bVar3 = (bool)(bVar10 >> 5 & 1);
              auVar31[0x3d] = bVar3 * auVar32[0x3d] | !bVar3 * auVar30[0x3d];
              bVar3 = (bool)(bVar10 >> 6 & 1);
              auVar31[0x3e] = bVar3 * auVar32[0x3e] | !bVar3 * auVar30[0x3e];
              auVar31[0x3f] = -cVar12 * auVar32[0x3f] | !(bool)-cVar12 * auVar30[0x3f];
              auVar30 = vpsubb_avx512bw(auVar41,auVar33);
              auVar33 = vmovdqu8_avx512bw(auVar33);
              auVar32[0] = (bVar2 & 1) * auVar33[0] | !(bool)(bVar2 & 1) * auVar30[0];
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar32[1] = bVar3 * auVar33[1] | !bVar3 * auVar30[1];
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar32[2] = bVar3 * auVar33[2] | !bVar3 * auVar30[2];
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar32[3] = bVar3 * auVar33[3] | !bVar3 * auVar30[3];
              bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
              auVar32[4] = bVar3 * auVar33[4] | !bVar3 * auVar30[4];
              bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
              auVar32[5] = bVar3 * auVar33[5] | !bVar3 * auVar30[5];
              bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
              auVar32[6] = bVar3 * auVar33[6] | !bVar3 * auVar30[6];
              bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
              auVar32[7] = bVar3 * auVar33[7] | !bVar3 * auVar30[7];
              auVar32[8] = (bVar4 & 1) * auVar33[8] | !(bool)(bVar4 & 1) * auVar30[8];
              bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
              auVar32[9] = bVar3 * auVar33[9] | !bVar3 * auVar30[9];
              bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
              auVar32[10] = bVar3 * auVar33[10] | !bVar3 * auVar30[10];
              bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
              auVar32[0xb] = bVar3 * auVar33[0xb] | !bVar3 * auVar30[0xb];
              bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
              auVar32[0xc] = bVar3 * auVar33[0xc] | !bVar3 * auVar30[0xc];
              bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
              auVar32[0xd] = bVar3 * auVar33[0xd] | !bVar3 * auVar30[0xd];
              bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
              auVar32[0xe] = bVar3 * auVar33[0xe] | !bVar3 * auVar30[0xe];
              bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
              auVar32[0xf] = bVar3 * auVar33[0xf] | !bVar3 * auVar30[0xf];
              auVar32[0x10] = (bVar5 & 1) * auVar33[0x10] | !(bool)(bVar5 & 1) * auVar30[0x10];
              bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
              auVar32[0x11] = bVar3 * auVar33[0x11] | !bVar3 * auVar30[0x11];
              bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
              auVar32[0x12] = bVar3 * auVar33[0x12] | !bVar3 * auVar30[0x12];
              bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
              auVar32[0x13] = bVar3 * auVar33[0x13] | !bVar3 * auVar30[0x13];
              bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
              auVar32[0x14] = bVar3 * auVar33[0x14] | !bVar3 * auVar30[0x14];
              bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
              auVar32[0x15] = bVar3 * auVar33[0x15] | !bVar3 * auVar30[0x15];
              bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
              auVar32[0x16] = bVar3 * auVar33[0x16] | !bVar3 * auVar30[0x16];
              bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
              auVar32[0x17] = bVar3 * auVar33[0x17] | !bVar3 * auVar30[0x17];
              auVar32[0x18] = (bVar6 & 1) * auVar33[0x18] | !(bool)(bVar6 & 1) * auVar30[0x18];
              bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
              auVar32[0x19] = bVar3 * auVar33[0x19] | !bVar3 * auVar30[0x19];
              bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
              auVar32[0x1a] = bVar3 * auVar33[0x1a] | !bVar3 * auVar30[0x1a];
              bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
              auVar32[0x1b] = bVar3 * auVar33[0x1b] | !bVar3 * auVar30[0x1b];
              bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
              auVar32[0x1c] = bVar3 * auVar33[0x1c] | !bVar3 * auVar30[0x1c];
              bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
              auVar32[0x1d] = bVar3 * auVar33[0x1d] | !bVar3 * auVar30[0x1d];
              bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
              auVar32[0x1e] = bVar3 * auVar33[0x1e] | !bVar3 * auVar30[0x1e];
              bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
              auVar32[0x1f] = bVar3 * auVar33[0x1f] | !bVar3 * auVar30[0x1f];
              auVar32[0x20] = (bVar7 & 1) * auVar33[0x20] | !(bool)(bVar7 & 1) * auVar30[0x20];
              bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
              auVar32[0x21] = bVar3 * auVar33[0x21] | !bVar3 * auVar30[0x21];
              bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
              auVar32[0x22] = bVar3 * auVar33[0x22] | !bVar3 * auVar30[0x22];
              bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
              auVar32[0x23] = bVar3 * auVar33[0x23] | !bVar3 * auVar30[0x23];
              bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
              auVar32[0x24] = bVar3 * auVar33[0x24] | !bVar3 * auVar30[0x24];
              bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
              auVar32[0x25] = bVar3 * auVar33[0x25] | !bVar3 * auVar30[0x25];
              bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
              auVar32[0x26] = bVar3 * auVar33[0x26] | !bVar3 * auVar30[0x26];
              bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
              auVar32[0x27] = bVar3 * auVar33[0x27] | !bVar3 * auVar30[0x27];
              auVar32[0x28] = (bVar8 & 1) * auVar33[0x28] | !(bool)(bVar8 & 1) * auVar30[0x28];
              bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
              auVar32[0x29] = bVar3 * auVar33[0x29] | !bVar3 * auVar30[0x29];
              bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
              auVar32[0x2a] = bVar3 * auVar33[0x2a] | !bVar3 * auVar30[0x2a];
              bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
              auVar32[0x2b] = bVar3 * auVar33[0x2b] | !bVar3 * auVar30[0x2b];
              bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
              auVar32[0x2c] = bVar3 * auVar33[0x2c] | !bVar3 * auVar30[0x2c];
              bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
              auVar32[0x2d] = bVar3 * auVar33[0x2d] | !bVar3 * auVar30[0x2d];
              bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
              auVar32[0x2e] = bVar3 * auVar33[0x2e] | !bVar3 * auVar30[0x2e];
              bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
              auVar32[0x2f] = bVar3 * auVar33[0x2f] | !bVar3 * auVar30[0x2f];
              auVar32[0x30] = (bVar9 & 1) * auVar33[0x30] | !(bool)(bVar9 & 1) * auVar30[0x30];
              bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
              auVar32[0x31] = bVar3 * auVar33[0x31] | !bVar3 * auVar30[0x31];
              bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
              auVar32[0x32] = bVar3 * auVar33[0x32] | !bVar3 * auVar30[0x32];
              bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
              auVar32[0x33] = bVar3 * auVar33[0x33] | !bVar3 * auVar30[0x33];
              bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
              auVar32[0x34] = bVar3 * auVar33[0x34] | !bVar3 * auVar30[0x34];
              bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
              auVar32[0x35] = bVar3 * auVar33[0x35] | !bVar3 * auVar30[0x35];
              bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
              auVar32[0x36] = bVar3 * auVar33[0x36] | !bVar3 * auVar30[0x36];
              bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
              auVar32[0x37] = bVar3 * auVar33[0x37] | !bVar3 * auVar30[0x37];
              auVar32[0x38] = (bVar10 & 1) * auVar33[0x38] | !(bool)(bVar10 & 1) * auVar30[0x38];
              bVar3 = (bool)(bVar10 >> 1 & 1);
              auVar32[0x39] = bVar3 * auVar33[0x39] | !bVar3 * auVar30[0x39];
              bVar3 = (bool)(bVar10 >> 2 & 1);
              auVar32[0x3a] = bVar3 * auVar33[0x3a] | !bVar3 * auVar30[0x3a];
              bVar3 = (bool)(bVar10 >> 3 & 1);
              auVar32[0x3b] = bVar3 * auVar33[0x3b] | !bVar3 * auVar30[0x3b];
              bVar3 = (bool)(bVar10 >> 4 & 1);
              auVar32[0x3c] = bVar3 * auVar33[0x3c] | !bVar3 * auVar30[0x3c];
              bVar3 = (bool)(bVar10 >> 5 & 1);
              auVar32[0x3d] = bVar3 * auVar33[0x3d] | !bVar3 * auVar30[0x3d];
              bVar3 = (bool)(bVar10 >> 6 & 1);
              auVar32[0x3e] = bVar3 * auVar33[0x3e] | !bVar3 * auVar30[0x3e];
              auVar32[0x3f] = -cVar12 * auVar33[0x3f] | !(bool)-cVar12 * auVar30[0x3f];
              auVar30 = vpsubb_avx512bw(auVar41,auVar34);
              auVar33 = vmovdqu8_avx512bw(auVar34);
              auVar34[0] = (bVar2 & 1) * auVar33[0] | !(bool)(bVar2 & 1) * auVar30[0];
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar34[1] = bVar3 * auVar33[1] | !bVar3 * auVar30[1];
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar34[2] = bVar3 * auVar33[2] | !bVar3 * auVar30[2];
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar34[3] = bVar3 * auVar33[3] | !bVar3 * auVar30[3];
              bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
              auVar34[4] = bVar3 * auVar33[4] | !bVar3 * auVar30[4];
              bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
              auVar34[5] = bVar3 * auVar33[5] | !bVar3 * auVar30[5];
              bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
              auVar34[6] = bVar3 * auVar33[6] | !bVar3 * auVar30[6];
              bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
              auVar34[7] = bVar3 * auVar33[7] | !bVar3 * auVar30[7];
              auVar34[8] = (bVar4 & 1) * auVar33[8] | !(bool)(bVar4 & 1) * auVar30[8];
              bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
              auVar34[9] = bVar3 * auVar33[9] | !bVar3 * auVar30[9];
              bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
              auVar34[10] = bVar3 * auVar33[10] | !bVar3 * auVar30[10];
              bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
              auVar34[0xb] = bVar3 * auVar33[0xb] | !bVar3 * auVar30[0xb];
              bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
              auVar34[0xc] = bVar3 * auVar33[0xc] | !bVar3 * auVar30[0xc];
              bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
              auVar34[0xd] = bVar3 * auVar33[0xd] | !bVar3 * auVar30[0xd];
              bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
              auVar34[0xe] = bVar3 * auVar33[0xe] | !bVar3 * auVar30[0xe];
              bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
              auVar34[0xf] = bVar3 * auVar33[0xf] | !bVar3 * auVar30[0xf];
              auVar34[0x10] = (bVar5 & 1) * auVar33[0x10] | !(bool)(bVar5 & 1) * auVar30[0x10];
              bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
              auVar34[0x11] = bVar3 * auVar33[0x11] | !bVar3 * auVar30[0x11];
              bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
              auVar34[0x12] = bVar3 * auVar33[0x12] | !bVar3 * auVar30[0x12];
              bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
              auVar34[0x13] = bVar3 * auVar33[0x13] | !bVar3 * auVar30[0x13];
              bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
              auVar34[0x14] = bVar3 * auVar33[0x14] | !bVar3 * auVar30[0x14];
              bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
              auVar34[0x15] = bVar3 * auVar33[0x15] | !bVar3 * auVar30[0x15];
              bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
              auVar34[0x16] = bVar3 * auVar33[0x16] | !bVar3 * auVar30[0x16];
              bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
              auVar34[0x17] = bVar3 * auVar33[0x17] | !bVar3 * auVar30[0x17];
              auVar34[0x18] = (bVar6 & 1) * auVar33[0x18] | !(bool)(bVar6 & 1) * auVar30[0x18];
              bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
              auVar34[0x19] = bVar3 * auVar33[0x19] | !bVar3 * auVar30[0x19];
              bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
              auVar34[0x1a] = bVar3 * auVar33[0x1a] | !bVar3 * auVar30[0x1a];
              bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
              auVar34[0x1b] = bVar3 * auVar33[0x1b] | !bVar3 * auVar30[0x1b];
              bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
              auVar34[0x1c] = bVar3 * auVar33[0x1c] | !bVar3 * auVar30[0x1c];
              bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
              auVar34[0x1d] = bVar3 * auVar33[0x1d] | !bVar3 * auVar30[0x1d];
              bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
              auVar34[0x1e] = bVar3 * auVar33[0x1e] | !bVar3 * auVar30[0x1e];
              bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
              auVar34[0x1f] = bVar3 * auVar33[0x1f] | !bVar3 * auVar30[0x1f];
              auVar34[0x20] = (bVar7 & 1) * auVar33[0x20] | !(bool)(bVar7 & 1) * auVar30[0x20];
              bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
              auVar34[0x21] = bVar3 * auVar33[0x21] | !bVar3 * auVar30[0x21];
              bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
              auVar34[0x22] = bVar3 * auVar33[0x22] | !bVar3 * auVar30[0x22];
              bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
              auVar34[0x23] = bVar3 * auVar33[0x23] | !bVar3 * auVar30[0x23];
              bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
              auVar34[0x24] = bVar3 * auVar33[0x24] | !bVar3 * auVar30[0x24];
              bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
              auVar34[0x25] = bVar3 * auVar33[0x25] | !bVar3 * auVar30[0x25];
              bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
              auVar34[0x26] = bVar3 * auVar33[0x26] | !bVar3 * auVar30[0x26];
              bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
              auVar34[0x27] = bVar3 * auVar33[0x27] | !bVar3 * auVar30[0x27];
              auVar34[0x28] = (bVar8 & 1) * auVar33[0x28] | !(bool)(bVar8 & 1) * auVar30[0x28];
              bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
              auVar34[0x29] = bVar3 * auVar33[0x29] | !bVar3 * auVar30[0x29];
              bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
              auVar34[0x2a] = bVar3 * auVar33[0x2a] | !bVar3 * auVar30[0x2a];
              bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
              auVar34[0x2b] = bVar3 * auVar33[0x2b] | !bVar3 * auVar30[0x2b];
              bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
              auVar34[0x2c] = bVar3 * auVar33[0x2c] | !bVar3 * auVar30[0x2c];
              bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
              auVar34[0x2d] = bVar3 * auVar33[0x2d] | !bVar3 * auVar30[0x2d];
              bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
              auVar34[0x2e] = bVar3 * auVar33[0x2e] | !bVar3 * auVar30[0x2e];
              bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
              auVar34[0x2f] = bVar3 * auVar33[0x2f] | !bVar3 * auVar30[0x2f];
              auVar34[0x30] = (bVar9 & 1) * auVar33[0x30] | !(bool)(bVar9 & 1) * auVar30[0x30];
              bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
              auVar34[0x31] = bVar3 * auVar33[0x31] | !bVar3 * auVar30[0x31];
              bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
              auVar34[0x32] = bVar3 * auVar33[0x32] | !bVar3 * auVar30[0x32];
              bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
              auVar34[0x33] = bVar3 * auVar33[0x33] | !bVar3 * auVar30[0x33];
              bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
              auVar34[0x34] = bVar3 * auVar33[0x34] | !bVar3 * auVar30[0x34];
              bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
              auVar34[0x35] = bVar3 * auVar33[0x35] | !bVar3 * auVar30[0x35];
              bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
              auVar34[0x36] = bVar3 * auVar33[0x36] | !bVar3 * auVar30[0x36];
              bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
              auVar34[0x37] = bVar3 * auVar33[0x37] | !bVar3 * auVar30[0x37];
              auVar34[0x38] = (bVar10 & 1) * auVar33[0x38] | !(bool)(bVar10 & 1) * auVar30[0x38];
              bVar3 = (bool)(bVar10 >> 1 & 1);
              auVar34[0x39] = bVar3 * auVar33[0x39] | !bVar3 * auVar30[0x39];
              bVar3 = (bool)(bVar10 >> 2 & 1);
              auVar34[0x3a] = bVar3 * auVar33[0x3a] | !bVar3 * auVar30[0x3a];
              bVar3 = (bool)(bVar10 >> 3 & 1);
              auVar34[0x3b] = bVar3 * auVar33[0x3b] | !bVar3 * auVar30[0x3b];
              bVar3 = (bool)(bVar10 >> 4 & 1);
              auVar34[0x3c] = bVar3 * auVar33[0x3c] | !bVar3 * auVar30[0x3c];
              bVar3 = (bool)(bVar10 >> 5 & 1);
              auVar34[0x3d] = bVar3 * auVar33[0x3d] | !bVar3 * auVar30[0x3d];
              bVar3 = (bool)(bVar10 >> 6 & 1);
              auVar34[0x3e] = bVar3 * auVar33[0x3e] | !bVar3 * auVar30[0x3e];
              auVar34[0x3f] = -cVar12 * auVar33[0x3f] | !(bool)-cVar12 * auVar30[0x3f];
              auVar30 = vpsubb_avx512bw(auVar41,auVar35);
              auVar33 = vmovdqu8_avx512bw(auVar35);
              auVar35[0] = (bVar2 & 1) * auVar33[0] | !(bool)(bVar2 & 1) * auVar30[0];
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar35[1] = bVar3 * auVar33[1] | !bVar3 * auVar30[1];
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar35[2] = bVar3 * auVar33[2] | !bVar3 * auVar30[2];
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar35[3] = bVar3 * auVar33[3] | !bVar3 * auVar30[3];
              bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
              auVar35[4] = bVar3 * auVar33[4] | !bVar3 * auVar30[4];
              bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
              auVar35[5] = bVar3 * auVar33[5] | !bVar3 * auVar30[5];
              bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
              auVar35[6] = bVar3 * auVar33[6] | !bVar3 * auVar30[6];
              bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
              auVar35[7] = bVar3 * auVar33[7] | !bVar3 * auVar30[7];
              auVar35[8] = (bVar4 & 1) * auVar33[8] | !(bool)(bVar4 & 1) * auVar30[8];
              bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
              auVar35[9] = bVar3 * auVar33[9] | !bVar3 * auVar30[9];
              bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
              auVar35[10] = bVar3 * auVar33[10] | !bVar3 * auVar30[10];
              bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
              auVar35[0xb] = bVar3 * auVar33[0xb] | !bVar3 * auVar30[0xb];
              bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
              auVar35[0xc] = bVar3 * auVar33[0xc] | !bVar3 * auVar30[0xc];
              bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
              auVar35[0xd] = bVar3 * auVar33[0xd] | !bVar3 * auVar30[0xd];
              bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
              auVar35[0xe] = bVar3 * auVar33[0xe] | !bVar3 * auVar30[0xe];
              bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
              auVar35[0xf] = bVar3 * auVar33[0xf] | !bVar3 * auVar30[0xf];
              auVar35[0x10] = (bVar5 & 1) * auVar33[0x10] | !(bool)(bVar5 & 1) * auVar30[0x10];
              bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
              auVar35[0x11] = bVar3 * auVar33[0x11] | !bVar3 * auVar30[0x11];
              bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
              auVar35[0x12] = bVar3 * auVar33[0x12] | !bVar3 * auVar30[0x12];
              bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
              auVar35[0x13] = bVar3 * auVar33[0x13] | !bVar3 * auVar30[0x13];
              bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
              auVar35[0x14] = bVar3 * auVar33[0x14] | !bVar3 * auVar30[0x14];
              bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
              auVar35[0x15] = bVar3 * auVar33[0x15] | !bVar3 * auVar30[0x15];
              bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
              auVar35[0x16] = bVar3 * auVar33[0x16] | !bVar3 * auVar30[0x16];
              bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
              auVar35[0x17] = bVar3 * auVar33[0x17] | !bVar3 * auVar30[0x17];
              auVar35[0x18] = (bVar6 & 1) * auVar33[0x18] | !(bool)(bVar6 & 1) * auVar30[0x18];
              bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
              auVar35[0x19] = bVar3 * auVar33[0x19] | !bVar3 * auVar30[0x19];
              bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
              auVar35[0x1a] = bVar3 * auVar33[0x1a] | !bVar3 * auVar30[0x1a];
              bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
              auVar35[0x1b] = bVar3 * auVar33[0x1b] | !bVar3 * auVar30[0x1b];
              bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
              auVar35[0x1c] = bVar3 * auVar33[0x1c] | !bVar3 * auVar30[0x1c];
              bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
              auVar35[0x1d] = bVar3 * auVar33[0x1d] | !bVar3 * auVar30[0x1d];
              bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
              auVar35[0x1e] = bVar3 * auVar33[0x1e] | !bVar3 * auVar30[0x1e];
              bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
              auVar35[0x1f] = bVar3 * auVar33[0x1f] | !bVar3 * auVar30[0x1f];
              auVar35[0x20] = (bVar7 & 1) * auVar33[0x20] | !(bool)(bVar7 & 1) * auVar30[0x20];
              bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
              auVar35[0x21] = bVar3 * auVar33[0x21] | !bVar3 * auVar30[0x21];
              bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
              auVar35[0x22] = bVar3 * auVar33[0x22] | !bVar3 * auVar30[0x22];
              bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
              auVar35[0x23] = bVar3 * auVar33[0x23] | !bVar3 * auVar30[0x23];
              bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
              auVar35[0x24] = bVar3 * auVar33[0x24] | !bVar3 * auVar30[0x24];
              bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
              auVar35[0x25] = bVar3 * auVar33[0x25] | !bVar3 * auVar30[0x25];
              bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
              auVar35[0x26] = bVar3 * auVar33[0x26] | !bVar3 * auVar30[0x26];
              bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
              auVar35[0x27] = bVar3 * auVar33[0x27] | !bVar3 * auVar30[0x27];
              auVar35[0x28] = (bVar8 & 1) * auVar33[0x28] | !(bool)(bVar8 & 1) * auVar30[0x28];
              bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
              auVar35[0x29] = bVar3 * auVar33[0x29] | !bVar3 * auVar30[0x29];
              bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
              auVar35[0x2a] = bVar3 * auVar33[0x2a] | !bVar3 * auVar30[0x2a];
              bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
              auVar35[0x2b] = bVar3 * auVar33[0x2b] | !bVar3 * auVar30[0x2b];
              bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
              auVar35[0x2c] = bVar3 * auVar33[0x2c] | !bVar3 * auVar30[0x2c];
              bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
              auVar35[0x2d] = bVar3 * auVar33[0x2d] | !bVar3 * auVar30[0x2d];
              bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
              auVar35[0x2e] = bVar3 * auVar33[0x2e] | !bVar3 * auVar30[0x2e];
              bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
              auVar35[0x2f] = bVar3 * auVar33[0x2f] | !bVar3 * auVar30[0x2f];
              auVar35[0x30] = (bVar9 & 1) * auVar33[0x30] | !(bool)(bVar9 & 1) * auVar30[0x30];
              bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
              auVar35[0x31] = bVar3 * auVar33[0x31] | !bVar3 * auVar30[0x31];
              bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
              auVar35[0x32] = bVar3 * auVar33[0x32] | !bVar3 * auVar30[0x32];
              bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
              auVar35[0x33] = bVar3 * auVar33[0x33] | !bVar3 * auVar30[0x33];
              bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
              auVar35[0x34] = bVar3 * auVar33[0x34] | !bVar3 * auVar30[0x34];
              bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
              auVar35[0x35] = bVar3 * auVar33[0x35] | !bVar3 * auVar30[0x35];
              bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
              auVar35[0x36] = bVar3 * auVar33[0x36] | !bVar3 * auVar30[0x36];
              bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
              auVar35[0x37] = bVar3 * auVar33[0x37] | !bVar3 * auVar30[0x37];
              auVar35[0x38] = (bVar10 & 1) * auVar33[0x38] | !(bool)(bVar10 & 1) * auVar30[0x38];
              bVar3 = (bool)(bVar10 >> 1 & 1);
              auVar35[0x39] = bVar3 * auVar33[0x39] | !bVar3 * auVar30[0x39];
              bVar3 = (bool)(bVar10 >> 2 & 1);
              auVar35[0x3a] = bVar3 * auVar33[0x3a] | !bVar3 * auVar30[0x3a];
              bVar3 = (bool)(bVar10 >> 3 & 1);
              auVar35[0x3b] = bVar3 * auVar33[0x3b] | !bVar3 * auVar30[0x3b];
              bVar3 = (bool)(bVar10 >> 4 & 1);
              auVar35[0x3c] = bVar3 * auVar33[0x3c] | !bVar3 * auVar30[0x3c];
              bVar3 = (bool)(bVar10 >> 5 & 1);
              auVar35[0x3d] = bVar3 * auVar33[0x3d] | !bVar3 * auVar30[0x3d];
              bVar3 = (bool)(bVar10 >> 6 & 1);
              auVar35[0x3e] = bVar3 * auVar33[0x3e] | !bVar3 * auVar30[0x3e];
              auVar35[0x3f] = -cVar12 * auVar33[0x3f] | !(bool)-cVar12 * auVar30[0x3f];
              auVar30 = vpsubb_avx512bw(auVar41,auVar36);
              auVar33 = vmovdqu8_avx512bw(auVar36);
              auVar36[0] = (bVar2 & 1) * auVar33[0] | !(bool)(bVar2 & 1) * auVar30[0];
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar36[1] = bVar3 * auVar33[1] | !bVar3 * auVar30[1];
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar36[2] = bVar3 * auVar33[2] | !bVar3 * auVar30[2];
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar36[3] = bVar3 * auVar33[3] | !bVar3 * auVar30[3];
              bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
              auVar36[4] = bVar3 * auVar33[4] | !bVar3 * auVar30[4];
              bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
              auVar36[5] = bVar3 * auVar33[5] | !bVar3 * auVar30[5];
              bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
              auVar36[6] = bVar3 * auVar33[6] | !bVar3 * auVar30[6];
              bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
              auVar36[7] = bVar3 * auVar33[7] | !bVar3 * auVar30[7];
              auVar36[8] = (bVar4 & 1) * auVar33[8] | !(bool)(bVar4 & 1) * auVar30[8];
              bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
              auVar36[9] = bVar3 * auVar33[9] | !bVar3 * auVar30[9];
              bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
              auVar36[10] = bVar3 * auVar33[10] | !bVar3 * auVar30[10];
              bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
              auVar36[0xb] = bVar3 * auVar33[0xb] | !bVar3 * auVar30[0xb];
              bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
              auVar36[0xc] = bVar3 * auVar33[0xc] | !bVar3 * auVar30[0xc];
              bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
              auVar36[0xd] = bVar3 * auVar33[0xd] | !bVar3 * auVar30[0xd];
              bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
              auVar36[0xe] = bVar3 * auVar33[0xe] | !bVar3 * auVar30[0xe];
              bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
              auVar36[0xf] = bVar3 * auVar33[0xf] | !bVar3 * auVar30[0xf];
              auVar36[0x10] = (bVar5 & 1) * auVar33[0x10] | !(bool)(bVar5 & 1) * auVar30[0x10];
              bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
              auVar36[0x11] = bVar3 * auVar33[0x11] | !bVar3 * auVar30[0x11];
              bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
              auVar36[0x12] = bVar3 * auVar33[0x12] | !bVar3 * auVar30[0x12];
              bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
              auVar36[0x13] = bVar3 * auVar33[0x13] | !bVar3 * auVar30[0x13];
              bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
              auVar36[0x14] = bVar3 * auVar33[0x14] | !bVar3 * auVar30[0x14];
              bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
              auVar36[0x15] = bVar3 * auVar33[0x15] | !bVar3 * auVar30[0x15];
              bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
              auVar36[0x16] = bVar3 * auVar33[0x16] | !bVar3 * auVar30[0x16];
              bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
              auVar36[0x17] = bVar3 * auVar33[0x17] | !bVar3 * auVar30[0x17];
              auVar36[0x18] = (bVar6 & 1) * auVar33[0x18] | !(bool)(bVar6 & 1) * auVar30[0x18];
              bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
              auVar36[0x19] = bVar3 * auVar33[0x19] | !bVar3 * auVar30[0x19];
              bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
              auVar36[0x1a] = bVar3 * auVar33[0x1a] | !bVar3 * auVar30[0x1a];
              bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
              auVar36[0x1b] = bVar3 * auVar33[0x1b] | !bVar3 * auVar30[0x1b];
              bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
              auVar36[0x1c] = bVar3 * auVar33[0x1c] | !bVar3 * auVar30[0x1c];
              bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
              auVar36[0x1d] = bVar3 * auVar33[0x1d] | !bVar3 * auVar30[0x1d];
              bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
              auVar36[0x1e] = bVar3 * auVar33[0x1e] | !bVar3 * auVar30[0x1e];
              bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
              auVar36[0x1f] = bVar3 * auVar33[0x1f] | !bVar3 * auVar30[0x1f];
              auVar36[0x20] = (bVar7 & 1) * auVar33[0x20] | !(bool)(bVar7 & 1) * auVar30[0x20];
              bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
              auVar36[0x21] = bVar3 * auVar33[0x21] | !bVar3 * auVar30[0x21];
              bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
              auVar36[0x22] = bVar3 * auVar33[0x22] | !bVar3 * auVar30[0x22];
              bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
              auVar36[0x23] = bVar3 * auVar33[0x23] | !bVar3 * auVar30[0x23];
              bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
              auVar36[0x24] = bVar3 * auVar33[0x24] | !bVar3 * auVar30[0x24];
              bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
              auVar36[0x25] = bVar3 * auVar33[0x25] | !bVar3 * auVar30[0x25];
              bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
              auVar36[0x26] = bVar3 * auVar33[0x26] | !bVar3 * auVar30[0x26];
              bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
              auVar36[0x27] = bVar3 * auVar33[0x27] | !bVar3 * auVar30[0x27];
              auVar36[0x28] = (bVar8 & 1) * auVar33[0x28] | !(bool)(bVar8 & 1) * auVar30[0x28];
              bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
              auVar36[0x29] = bVar3 * auVar33[0x29] | !bVar3 * auVar30[0x29];
              bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
              auVar36[0x2a] = bVar3 * auVar33[0x2a] | !bVar3 * auVar30[0x2a];
              bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
              auVar36[0x2b] = bVar3 * auVar33[0x2b] | !bVar3 * auVar30[0x2b];
              bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
              auVar36[0x2c] = bVar3 * auVar33[0x2c] | !bVar3 * auVar30[0x2c];
              bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
              auVar36[0x2d] = bVar3 * auVar33[0x2d] | !bVar3 * auVar30[0x2d];
              bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
              auVar36[0x2e] = bVar3 * auVar33[0x2e] | !bVar3 * auVar30[0x2e];
              bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
              auVar36[0x2f] = bVar3 * auVar33[0x2f] | !bVar3 * auVar30[0x2f];
              auVar36[0x30] = (bVar9 & 1) * auVar33[0x30] | !(bool)(bVar9 & 1) * auVar30[0x30];
              bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
              auVar36[0x31] = bVar3 * auVar33[0x31] | !bVar3 * auVar30[0x31];
              bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
              auVar36[0x32] = bVar3 * auVar33[0x32] | !bVar3 * auVar30[0x32];
              bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
              auVar36[0x33] = bVar3 * auVar33[0x33] | !bVar3 * auVar30[0x33];
              bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
              auVar36[0x34] = bVar3 * auVar33[0x34] | !bVar3 * auVar30[0x34];
              bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
              auVar36[0x35] = bVar3 * auVar33[0x35] | !bVar3 * auVar30[0x35];
              bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
              auVar36[0x36] = bVar3 * auVar33[0x36] | !bVar3 * auVar30[0x36];
              bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
              auVar36[0x37] = bVar3 * auVar33[0x37] | !bVar3 * auVar30[0x37];
              auVar36[0x38] = (bVar10 & 1) * auVar33[0x38] | !(bool)(bVar10 & 1) * auVar30[0x38];
              bVar3 = (bool)(bVar10 >> 1 & 1);
              auVar36[0x39] = bVar3 * auVar33[0x39] | !bVar3 * auVar30[0x39];
              bVar3 = (bool)(bVar10 >> 2 & 1);
              auVar36[0x3a] = bVar3 * auVar33[0x3a] | !bVar3 * auVar30[0x3a];
              bVar3 = (bool)(bVar10 >> 3 & 1);
              auVar36[0x3b] = bVar3 * auVar33[0x3b] | !bVar3 * auVar30[0x3b];
              bVar3 = (bool)(bVar10 >> 4 & 1);
              auVar36[0x3c] = bVar3 * auVar33[0x3c] | !bVar3 * auVar30[0x3c];
              bVar3 = (bool)(bVar10 >> 5 & 1);
              auVar36[0x3d] = bVar3 * auVar33[0x3d] | !bVar3 * auVar30[0x3d];
              bVar3 = (bool)(bVar10 >> 6 & 1);
              auVar36[0x3e] = bVar3 * auVar33[0x3e] | !bVar3 * auVar30[0x3e];
              auVar36[0x3f] = -cVar12 * auVar33[0x3f] | !(bool)-cVar12 * auVar30[0x3f];
              auVar30 = vpsubb_avx512bw(auVar41,auVar37);
              auVar37 = vmovdqu8_avx512bw(auVar37);
              auVar33[0] = (bVar2 & 1) * auVar37[0] | !(bool)(bVar2 & 1) * auVar30[0];
              bVar3 = (bool)((byte)(uVar11 >> 1) & 1);
              auVar33[1] = bVar3 * auVar37[1] | !bVar3 * auVar30[1];
              bVar3 = (bool)((byte)(uVar11 >> 2) & 1);
              auVar33[2] = bVar3 * auVar37[2] | !bVar3 * auVar30[2];
              bVar3 = (bool)((byte)(uVar11 >> 3) & 1);
              auVar33[3] = bVar3 * auVar37[3] | !bVar3 * auVar30[3];
              bVar3 = (bool)((byte)(uVar11 >> 4) & 1);
              auVar33[4] = bVar3 * auVar37[4] | !bVar3 * auVar30[4];
              bVar3 = (bool)((byte)(uVar11 >> 5) & 1);
              auVar33[5] = bVar3 * auVar37[5] | !bVar3 * auVar30[5];
              bVar3 = (bool)((byte)(uVar11 >> 6) & 1);
              auVar33[6] = bVar3 * auVar37[6] | !bVar3 * auVar30[6];
              bVar3 = (bool)((byte)(uVar11 >> 7) & 1);
              auVar33[7] = bVar3 * auVar37[7] | !bVar3 * auVar30[7];
              auVar33[8] = (bVar4 & 1) * auVar37[8] | !(bool)(bVar4 & 1) * auVar30[8];
              bVar3 = (bool)((byte)(uVar11 >> 9) & 1);
              auVar33[9] = bVar3 * auVar37[9] | !bVar3 * auVar30[9];
              bVar3 = (bool)((byte)(uVar11 >> 10) & 1);
              auVar33[10] = bVar3 * auVar37[10] | !bVar3 * auVar30[10];
              bVar3 = (bool)((byte)(uVar11 >> 0xb) & 1);
              auVar33[0xb] = bVar3 * auVar37[0xb] | !bVar3 * auVar30[0xb];
              bVar3 = (bool)((byte)(uVar11 >> 0xc) & 1);
              auVar33[0xc] = bVar3 * auVar37[0xc] | !bVar3 * auVar30[0xc];
              bVar3 = (bool)((byte)(uVar11 >> 0xd) & 1);
              auVar33[0xd] = bVar3 * auVar37[0xd] | !bVar3 * auVar30[0xd];
              bVar3 = (bool)((byte)(uVar11 >> 0xe) & 1);
              auVar33[0xe] = bVar3 * auVar37[0xe] | !bVar3 * auVar30[0xe];
              bVar3 = (bool)((byte)(uVar11 >> 0xf) & 1);
              auVar33[0xf] = bVar3 * auVar37[0xf] | !bVar3 * auVar30[0xf];
              auVar33[0x10] = (bVar5 & 1) * auVar37[0x10] | !(bool)(bVar5 & 1) * auVar30[0x10];
              bVar3 = (bool)((byte)(uVar11 >> 0x11) & 1);
              auVar33[0x11] = bVar3 * auVar37[0x11] | !bVar3 * auVar30[0x11];
              bVar3 = (bool)((byte)(uVar11 >> 0x12) & 1);
              auVar33[0x12] = bVar3 * auVar37[0x12] | !bVar3 * auVar30[0x12];
              bVar3 = (bool)((byte)(uVar11 >> 0x13) & 1);
              auVar33[0x13] = bVar3 * auVar37[0x13] | !bVar3 * auVar30[0x13];
              bVar3 = (bool)((byte)(uVar11 >> 0x14) & 1);
              auVar33[0x14] = bVar3 * auVar37[0x14] | !bVar3 * auVar30[0x14];
              bVar3 = (bool)((byte)(uVar11 >> 0x15) & 1);
              auVar33[0x15] = bVar3 * auVar37[0x15] | !bVar3 * auVar30[0x15];
              bVar3 = (bool)((byte)(uVar11 >> 0x16) & 1);
              auVar33[0x16] = bVar3 * auVar37[0x16] | !bVar3 * auVar30[0x16];
              bVar3 = (bool)((byte)(uVar11 >> 0x17) & 1);
              auVar33[0x17] = bVar3 * auVar37[0x17] | !bVar3 * auVar30[0x17];
              auVar33[0x18] = (bVar6 & 1) * auVar37[0x18] | !(bool)(bVar6 & 1) * auVar30[0x18];
              bVar3 = (bool)((byte)(uVar11 >> 0x19) & 1);
              auVar33[0x19] = bVar3 * auVar37[0x19] | !bVar3 * auVar30[0x19];
              bVar3 = (bool)((byte)(uVar11 >> 0x1a) & 1);
              auVar33[0x1a] = bVar3 * auVar37[0x1a] | !bVar3 * auVar30[0x1a];
              bVar3 = (bool)((byte)(uVar11 >> 0x1b) & 1);
              auVar33[0x1b] = bVar3 * auVar37[0x1b] | !bVar3 * auVar30[0x1b];
              bVar3 = (bool)((byte)(uVar11 >> 0x1c) & 1);
              auVar33[0x1c] = bVar3 * auVar37[0x1c] | !bVar3 * auVar30[0x1c];
              bVar3 = (bool)((byte)(uVar11 >> 0x1d) & 1);
              auVar33[0x1d] = bVar3 * auVar37[0x1d] | !bVar3 * auVar30[0x1d];
              bVar3 = (bool)((byte)(uVar11 >> 0x1e) & 1);
              auVar33[0x1e] = bVar3 * auVar37[0x1e] | !bVar3 * auVar30[0x1e];
              bVar3 = (bool)((byte)(uVar11 >> 0x1f) & 1);
              auVar33[0x1f] = bVar3 * auVar37[0x1f] | !bVar3 * auVar30[0x1f];
              auVar33[0x20] = (bVar7 & 1) * auVar37[0x20] | !(bool)(bVar7 & 1) * auVar30[0x20];
              bVar3 = (bool)((byte)(uVar11 >> 0x21) & 1);
              auVar33[0x21] = bVar3 * auVar37[0x21] | !bVar3 * auVar30[0x21];
              bVar3 = (bool)((byte)(uVar11 >> 0x22) & 1);
              auVar33[0x22] = bVar3 * auVar37[0x22] | !bVar3 * auVar30[0x22];
              bVar3 = (bool)((byte)(uVar11 >> 0x23) & 1);
              auVar33[0x23] = bVar3 * auVar37[0x23] | !bVar3 * auVar30[0x23];
              bVar3 = (bool)((byte)(uVar11 >> 0x24) & 1);
              auVar33[0x24] = bVar3 * auVar37[0x24] | !bVar3 * auVar30[0x24];
              bVar3 = (bool)((byte)(uVar11 >> 0x25) & 1);
              auVar33[0x25] = bVar3 * auVar37[0x25] | !bVar3 * auVar30[0x25];
              bVar3 = (bool)((byte)(uVar11 >> 0x26) & 1);
              auVar33[0x26] = bVar3 * auVar37[0x26] | !bVar3 * auVar30[0x26];
              bVar3 = (bool)((byte)(uVar11 >> 0x27) & 1);
              auVar33[0x27] = bVar3 * auVar37[0x27] | !bVar3 * auVar30[0x27];
              auVar33[0x28] = (bVar8 & 1) * auVar37[0x28] | !(bool)(bVar8 & 1) * auVar30[0x28];
              bVar3 = (bool)((byte)(uVar11 >> 0x29) & 1);
              auVar33[0x29] = bVar3 * auVar37[0x29] | !bVar3 * auVar30[0x29];
              bVar3 = (bool)((byte)(uVar11 >> 0x2a) & 1);
              auVar33[0x2a] = bVar3 * auVar37[0x2a] | !bVar3 * auVar30[0x2a];
              bVar3 = (bool)((byte)(uVar11 >> 0x2b) & 1);
              auVar33[0x2b] = bVar3 * auVar37[0x2b] | !bVar3 * auVar30[0x2b];
              bVar3 = (bool)((byte)(uVar11 >> 0x2c) & 1);
              auVar33[0x2c] = bVar3 * auVar37[0x2c] | !bVar3 * auVar30[0x2c];
              bVar3 = (bool)((byte)(uVar11 >> 0x2d) & 1);
              auVar33[0x2d] = bVar3 * auVar37[0x2d] | !bVar3 * auVar30[0x2d];
              bVar3 = (bool)((byte)(uVar11 >> 0x2e) & 1);
              auVar33[0x2e] = bVar3 * auVar37[0x2e] | !bVar3 * auVar30[0x2e];
              bVar3 = (bool)((byte)(uVar11 >> 0x2f) & 1);
              auVar33[0x2f] = bVar3 * auVar37[0x2f] | !bVar3 * auVar30[0x2f];
              auVar33[0x30] = (bVar9 & 1) * auVar37[0x30] | !(bool)(bVar9 & 1) * auVar30[0x30];
              bVar3 = (bool)((byte)(uVar11 >> 0x31) & 1);
              auVar33[0x31] = bVar3 * auVar37[0x31] | !bVar3 * auVar30[0x31];
              bVar3 = (bool)((byte)(uVar11 >> 0x32) & 1);
              auVar33[0x32] = bVar3 * auVar37[0x32] | !bVar3 * auVar30[0x32];
              bVar3 = (bool)((byte)(uVar11 >> 0x33) & 1);
              auVar33[0x33] = bVar3 * auVar37[0x33] | !bVar3 * auVar30[0x33];
              bVar3 = (bool)((byte)(uVar11 >> 0x34) & 1);
              auVar33[0x34] = bVar3 * auVar37[0x34] | !bVar3 * auVar30[0x34];
              bVar3 = (bool)((byte)(uVar11 >> 0x35) & 1);
              auVar33[0x35] = bVar3 * auVar37[0x35] | !bVar3 * auVar30[0x35];
              bVar3 = (bool)((byte)(uVar11 >> 0x36) & 1);
              auVar33[0x36] = bVar3 * auVar37[0x36] | !bVar3 * auVar30[0x36];
              bVar3 = (bool)((byte)(uVar11 >> 0x37) & 1);
              auVar33[0x37] = bVar3 * auVar37[0x37] | !bVar3 * auVar30[0x37];
              auVar33[0x38] = (bVar10 & 1) * auVar37[0x38] | !(bool)(bVar10 & 1) * auVar30[0x38];
              bVar3 = (bool)(bVar10 >> 1 & 1);
              auVar33[0x39] = bVar3 * auVar37[0x39] | !bVar3 * auVar30[0x39];
              bVar3 = (bool)(bVar10 >> 2 & 1);
              auVar33[0x3a] = bVar3 * auVar37[0x3a] | !bVar3 * auVar30[0x3a];
              bVar3 = (bool)(bVar10 >> 3 & 1);
              auVar33[0x3b] = bVar3 * auVar37[0x3b] | !bVar3 * auVar30[0x3b];
              bVar3 = (bool)(bVar10 >> 4 & 1);
              auVar33[0x3c] = bVar3 * auVar37[0x3c] | !bVar3 * auVar30[0x3c];
              bVar3 = (bool)(bVar10 >> 5 & 1);
              auVar33[0x3d] = bVar3 * auVar37[0x3d] | !bVar3 * auVar30[0x3d];
              bVar3 = (bool)(bVar10 >> 6 & 1);
              auVar33[0x3e] = bVar3 * auVar37[0x3e] | !bVar3 * auVar30[0x3e];
              auVar33[0x3f] = -cVar12 * auVar37[0x3f] | !(bool)-cVar12 * auVar30[0x3f];
              in_ZMM21 = vpdpbusds_avx512_vnni(in_ZMM21,auVar38,auVar40);
              in_ZMM22 = vpdpbusds_avx512_vnni(in_ZMM22,auVar38,auVar39);
              in_ZMM20 = vpdpbusds_avx512_vnni(in_ZMM20,auVar38,auVar31);
              in_ZMM19 = vpdpbusds_avx512_vnni(in_ZMM19,auVar38,auVar32);
              in_ZMM18 = vpdpbusds_avx512_vnni(in_ZMM18,auVar38,auVar34);
              in_ZMM17 = vpdpbusds_avx512_vnni(in_ZMM17,auVar38,auVar35);
              in_ZMM16 = vpdpbusds_avx512_vnni(in_ZMM16,auVar38,auVar36);
              auVar43 = vpdpbusds_avx512_vnni(auVar43,auVar38,auVar33);
              uVar21 = uVar21 + 0x40;
            } while ((width >> 6) << 6 != uVar21);
          }
          pfVar1 = callback.bias_addr + uVar24;
          fVar13 = *pfVar1;
          fVar14 = pfVar1[1];
          fVar15 = pfVar1[2];
          fVar16 = pfVar1[3];
          fVar17 = pfVar1[4];
          fVar18 = pfVar1[5];
          fVar19 = pfVar1[6];
          fVar20 = pfVar1[7];
          if (intgemm::kernels::relu<float>(intgemm::vector_s<(intgemm::CPUType)3,float>::type)::
              vconst_zero == '\0') {
            auVar28 = vmovdqu64_avx512f(auVar43);
            auVar27 = vmovdqu64_avx512f(in_ZMM16);
            auVar43 = vmovdqu64_avx512f(in_ZMM17);
            auVar41 = vmovdqu64_avx512f(in_ZMM18);
            auVar30 = vmovdqu64_avx512f(in_ZMM19);
            auVar31 = vmovdqu64_avx512f(in_ZMM20);
            auVar32 = vmovdqu64_avx512f(in_ZMM21);
            auVar33 = vmovdqu64_avx512f(in_ZMM22);
            auVar29 = ZEXT1664(auVar29._0_16_);
            Multiply<intgemm::callbacks::UnquantizeAndAddBiasAndWriteRelu>();
            in_ZMM22 = vmovdqu64_avx512f(auVar33);
            in_ZMM21 = vmovdqu64_avx512f(auVar32);
            in_ZMM20 = vmovdqu64_avx512f(auVar31);
            in_ZMM19 = vmovdqu64_avx512f(auVar30);
            in_ZMM18 = vmovdqu64_avx512f(auVar41);
            in_ZMM17 = vmovdqu64_avx512f(auVar43);
            in_ZMM16 = vmovdqu64_avx512f(auVar27);
            auVar43 = vmovdqu64_avx512f(auVar28);
            auVar29 = vpternlogd_avx512f(auVar29,auVar29,auVar29,0xff);
            auVar28 = vpmovsxbq_avx512f(ZEXT816(0xf0e07060b0a0302));
            auVar27 = vpmovsxbq_avx512f(ZEXT816(0xd0c050409080100));
          }
          auVar41 = vpunpckldq_avx512f(in_ZMM21,in_ZMM22);
          auVar30 = vpunpckhdq_avx512f(in_ZMM21,in_ZMM22);
          auVar41 = vpaddd_avx512f(auVar30,auVar41);
          auVar30 = vpunpckldq_avx512f(in_ZMM20,in_ZMM19);
          auVar31 = vpunpckhdq_avx512f(in_ZMM20,in_ZMM19);
          auVar30 = vpaddd_avx512f(auVar31,auVar30);
          auVar31 = vpunpcklqdq_avx512f(auVar41,auVar30);
          auVar41 = vpunpckhqdq_avx512f(auVar41,auVar30);
          auVar41 = vpaddd_avx512f(auVar41,auVar31);
          auVar30 = vpunpckldq_avx512f(in_ZMM18,in_ZMM17);
          auVar31 = vpunpckhdq_avx512f(in_ZMM18,in_ZMM17);
          auVar30 = vpaddd_avx512f(auVar31,auVar30);
          auVar31 = vpunpckldq_avx512f(in_ZMM16,auVar43);
          auVar43 = vpunpckhdq_avx512f(in_ZMM16,auVar43);
          auVar43 = vpaddd_avx512f(auVar43,auVar31);
          auVar31 = vpunpcklqdq_avx512f(auVar30,auVar43);
          auVar43 = vpunpckhqdq_avx512f(auVar30,auVar43);
          auVar43 = vpaddd_avx512f(auVar43,auVar31);
          auVar30 = vmovdqa64_avx512f(auVar41);
          auVar30 = vpermt2q_avx512f(auVar30,auVar27,auVar43);
          auVar43 = vpermt2q_avx512f(auVar41,auVar28,auVar43);
          auVar43 = vpaddd_avx512f(auVar43,auVar30);
          auVar26 = vextracti64x4_avx512f(auVar43,1);
          auVar26 = vpaddd_avx2(auVar43._0_32_,auVar26);
          auVar26 = vcvtdq2ps_avx(auVar26);
          auVar42._0_4_ = callback.unquant_mult * auVar26._0_4_ + fVar13;
          auVar42._4_4_ = callback.unquant_mult * auVar26._4_4_ + fVar14;
          auVar42._8_4_ = callback.unquant_mult * auVar26._8_4_ + fVar15;
          auVar42._12_4_ = callback.unquant_mult * auVar26._12_4_ + fVar16;
          auVar42._16_4_ = callback.unquant_mult * auVar26._16_4_ + fVar17;
          auVar42._20_4_ = callback.unquant_mult * auVar26._20_4_ + fVar18;
          auVar42._24_4_ = callback.unquant_mult * auVar26._24_4_ + fVar19;
          auVar42._28_4_ = auVar26._28_4_ + fVar20;
          auVar26 = vmaxps_avx(auVar42,intgemm::kernels::
                                       relu<float>(intgemm::vector_s<(intgemm::CPUType)3,float>::type)
                                       ::vconst_zero);
          *(undefined1 (*) [32])(callback.output_addr + ((int)uVar25 * B_cols + (int)uVar24)) =
               auVar26;
          uVar25 = uVar25 + 1;
          uVar22 = (ulong)((int)uVar22 + width);
        } while (uVar25 != A_rows);
      }
      uVar23 = (int)uVar24 + 8;
      uVar24 = (ulong)uVar23;
      local_2c0 = (ulong)((int)local_2c0 + (width >> 6) * 8);
    } while (uVar23 < B_cols);
  }
  return;
}

Assistant:

INTGEMM_AVX512VNNI static void Multiply(const int8_t *A, const int8_t *B, Index A_rows, Index width, Index B_cols, Callback callback) {
    assert(width % sizeof(Register) == 0);
    assert(B_cols % 8 == 0);
    assert(reinterpret_cast<uintptr_t>(A) % sizeof(Register) == 0);
    assert(reinterpret_cast<uintptr_t>(B) % sizeof(Register) == 0);
    auto callback_impl = callbacks::CallbackImpl<CPUType::AVX2, Callback>(callback);
    const Index simd_width = width / sizeof(Register);
    Register zeros = setzero_si<Register>();
    // Go over 8 columns of B at a time.
#pragma omp for
    for (Index B0_colidx = 0; B0_colidx < B_cols; B0_colidx += 8) {
      const Register *B0_col = reinterpret_cast<const Register*>(B) + B0_colidx * simd_width;
      // Process one row of A at a time.  Doesn't seem to be faster to do multiple rows of A at once.
      for (Index A_rowidx = 0; A_rowidx < A_rows; ++A_rowidx) {
        // Iterate over shared (inner) dimension.
        const Register *A_live = reinterpret_cast<const Register *>(A + A_rowidx * width);
        const Register *A_end = A_live + simd_width;
        const Register *B_live = B0_col;
        // TODO: separate first step.
        Register sum0 = zeros, sum1 = zeros, sum2 = zeros, sum3 = zeros, sum4 = zeros, sum5 = zeros, sum6 = zeros, sum7 = zeros;
        for (; A_live != A_end; ++A_live, B_live += 8) {
          Register a = *A_live;
          // Retrieve the conveniently consecutive values of B.
          Register b0 = *B_live;
          Register b1 = *(B_live + 1);
          Register b2 = *(B_live + 2);
          Register b3 = *(B_live + 3);
          Register b4 = *(B_live + 4);
          Register b5 = *(B_live + 5);
          Register b6 = *(B_live + 6);
          Register b7 = *(B_live + 7);
          // Get a mask where a is negative.
          __mmask64 neg_mask = _mm512_test_epi8_mask(a, _mm512_set1_epi8(-128));
          Register a_positive = _mm512_abs_epi8(a);
          // Negate by subtracting from zero with a mask.
          b0 = _mm512_mask_sub_epi8(b0, neg_mask, zeros, b0);
          b1 = _mm512_mask_sub_epi8(b1, neg_mask, zeros, b1);
          b2 = _mm512_mask_sub_epi8(b2, neg_mask, zeros, b2);
          b3 = _mm512_mask_sub_epi8(b3, neg_mask, zeros, b3);
          b4 = _mm512_mask_sub_epi8(b4, neg_mask, zeros, b4);
          b5 = _mm512_mask_sub_epi8(b5, neg_mask, zeros, b5);
          b6 = _mm512_mask_sub_epi8(b6, neg_mask, zeros, b6);
          b7 = _mm512_mask_sub_epi8(b7, neg_mask, zeros, b7);
          VNNI8(sum0, a_positive, b0);
          VNNI8(sum1, a_positive, b1);
          VNNI8(sum2, a_positive, b2);
          VNNI8(sum3, a_positive, b3);
          VNNI8(sum4, a_positive, b4);
          VNNI8(sum5, a_positive, b5);
          VNNI8(sum6, a_positive, b6);
          VNNI8(sum7, a_positive, b7);
        }
        Register pack0123 = Pack0123(sum0, sum1, sum2, sum3);
        Register pack4567 = Pack0123(sum4, sum5, sum6, sum7);
        auto total = PermuteSummer(pack0123, pack4567);
        callback_impl.Run(total, callbacks::OutputBufferInfo(A_rowidx, B0_colidx, A_rows, B_cols));
      }
    }
  }